

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<Ident*,Memory::ArenaAllocator,RealCount>::
MapUntil<Js::SourceTextModuleRecord::ResolveExternalModuleDependencies()::__0>
          (SListBase<Ident*,Memory::ArenaAllocator,RealCount> *this,anon_class_24_3_248f5e5f fn)

{
  code *pcVar1;
  undefined1 this_00 [8];
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppIVar4;
  undefined1 local_38 [8];
  Iterator iter;
  SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  iter.current = (NodeBase *)this;
  SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)local_38,(SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)this);
  while( true ) {
    if (iter.list == (SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = local_38;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    iter.list = (SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppIVar4 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_38);
    bVar2 = Js::SourceTextModuleRecord::ResolveExternalModuleDependencies::anon_class_24_3_248f5e5f
            ::operator()(&fn,*ppIVar4);
    if (bVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool MapUntil(Fn fn) const
    {
        Iterator iter(this);
        while (iter.Next())
        {
            if (fn(iter.Data()))
            {
                return true;
            }
        }
        return false;
    }